

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_regexp(JSParseState *s)

{
  byte bVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint32_t c;
  int iVar4;
  int iVar5;
  uint c_00;
  uint uVar6;
  uint uVar7;
  char *fmt;
  byte *p;
  byte *p_00;
  byte *pbVar8;
  bool bVar9;
  JSValue JVar10;
  uint8_t *p_next_1;
  StringBuffer local_78;
  StringBuffer local_58;
  uint8_t *p_next;
  
  local_58.ctx = s->ctx;
  puVar2 = s->buf_ptr;
  local_58.len = 0;
  local_58.size = 0x20;
  local_58.is_wide_char = 0;
  local_58.error_status = 0;
  local_58.str = js_alloc_string(local_58.ctx,0x20,0);
  if (local_58.str == (JSString *)0x0) {
    return -1;
  }
  local_78.ctx = s->ctx;
  local_78.len = 0;
  local_78.size = 1;
  local_78.is_wide_char = 0;
  local_78.error_status = 0;
  bVar9 = false;
  local_78.str = js_alloc_string(local_78.ctx,1,0);
  if (local_78.str == (JSString *)0x0) {
    local_78._16_8_ = local_78._16_8_ & 0xffffffff;
    local_78.error_status = -1;
  }
  else {
    p_00 = puVar2 + 1;
    do {
      if (s->buf_end <= p_00) {
LAB_0010e4e9:
        fmt = "unexpected end of regexp";
        goto LAB_0010e601;
      }
      p = p_00 + 1;
      bVar1 = *p_00;
      c = (uint32_t)bVar1;
      pbVar8 = p;
      bVar3 = true;
      if (bVar1 == 0x2f) {
        if (!bVar9) {
          goto switchD_0010e5b2_caseD_0;
        }
        c = 0x2f;
      }
      else if (bVar1 != 0x5b) {
        bVar3 = bVar9;
        if (bVar1 == 0x5c) {
          iVar5 = string_buffer_putc8(&local_58,0x5c);
          if (iVar5 != 0) break;
          bVar1 = p_00[1];
          c = (uint32_t)bVar1;
          pbVar8 = p_00 + 2;
          if (bVar1 == 0) {
            if (s->buf_end <= pbVar8) goto LAB_0010e4e9;
          }
          else if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_0010e5fa;
          if ((char)bVar1 < '\0') {
            c = unicode_from_utf8(p,6,&p_next_1);
            iVar5 = 0;
            if ((c & 0x1ffffe) == 0x2028) {
              iVar5 = 6;
            }
            iVar4 = 7;
            if (c < 0x110000) {
              pbVar8 = p_next_1;
              iVar4 = iVar5;
            }
            if (iVar4 != 0) {
              if (iVar4 == 6) goto LAB_0010e5fa;
              if (iVar4 != 7) {
                return iVar4;
              }
              goto switchD_0010e5b2_caseD_7;
            }
          }
        }
        else if (bVar1 == 0x5d) {
          c = 0x5d;
          bVar3 = false;
        }
        else {
          if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_0010e5fa:
            fmt = "unexpected line terminator in regexp";
            goto LAB_0010e601;
          }
          c = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            c = unicode_from_utf8(p_00,6,&p_next);
            if (0x10ffff < c) goto switchD_0010e5b2_caseD_7;
            pbVar8 = p_next;
            if ((c & 0x1ffffe) == 0x2028) goto LAB_0010e5fa;
          }
        }
      }
      bVar9 = bVar3;
      iVar5 = string_buffer_putc(&local_58,c);
      p_00 = pbVar8;
    } while (iVar5 == 0);
  }
switchD_0010e5b2_caseD_2:
  (*((local_58.ctx)->rt->mf).js_free)(&(local_58.ctx)->rt->malloc_state,local_58.str);
  local_58.str = (JSString *)0x0;
  (*((local_78.ctx)->rt->mf).js_free)(&(local_78.ctx)->rt->malloc_state,local_78.str);
  return -1;
  do {
    switch(uVar7) {
    case 0:
switchD_0010e5b2_caseD_0:
      p_next_1 = p + 1;
      c_00 = (uint)*p;
      if (((char)*p < '\0') && (c_00 = unicode_from_utf8(p,6,&p_next_1), 0x10ffff < c_00)) {
        uVar7 = 7;
        uVar6 = c_00;
      }
      else {
        if (c_00 < 0x80) {
          bVar9 = (lre_id_continue_table_ascii[c_00 >> 5] >> (c_00 & 0x1f) & 1) != 0;
        }
        else {
          iVar5 = lre_is_id_continue(c_00);
          bVar9 = (c_00 & 0x1ffffe) == 0x200c || iVar5 != 0;
        }
        uVar6 = (uint)bVar9;
        if (bVar9 == false) {
          uVar7 = 8;
        }
        else {
          iVar5 = string_buffer_putc(&local_78,c_00);
          bVar9 = iVar5 != 0;
          if (!bVar9) {
            p = p_next_1;
          }
          uVar7 = (uint)bVar9 * 2;
          uVar6 = CONCAT31((int3)((uint)iVar5 >> 8),bVar9);
        }
      }
      if (8 < uVar7) {
        return uVar6;
      }
      break;
    default:
      return (&switchD_0010e5b2::switchdataD_0017cbd4)[uVar7] + 0x17cbd4;
    case 2:
      goto switchD_0010e5b2_caseD_2;
    case 7:
      goto switchD_0010e5b2_caseD_7;
    case 8:
      (s->token).val = -0x7c;
      JVar10 = string_buffer_end(&local_58);
      (s->token).u.str.str = JVar10;
      JVar10 = string_buffer_end(&local_78);
      (s->token).u.regexp.flags = JVar10;
      s->buf_ptr = p;
      return 0;
    }
  } while( true );
switchD_0010e5b2_caseD_7:
  fmt = "invalid UTF-8 sequence";
LAB_0010e601:
  js_parse_error(s,fmt);
  goto switchD_0010e5b2_caseD_2;
}

Assistant:

static __exception int js_parse_regexp(JSParseState *s)
{
    const uint8_t *p;
    BOOL in_class;
    StringBuffer b_s, *b = &b_s;
    StringBuffer b2_s, *b2 = &b2_s;
    uint32_t c;

    p = s->buf_ptr;
    p++;
    in_class = FALSE;
    if (string_buffer_init(s->ctx, b, 32))
        return -1;
    if (string_buffer_init(s->ctx, b2, 1))
        goto fail;
    for(;;) {
        if (p >= s->buf_end) {
        eof_error:
            js_parse_error(s, "unexpected end of regexp");
            goto fail;
        }
        c = *p++;
        if (c == '\n' || c == '\r') {
            goto eol_error;
        } else if (c == '/') {
            if (!in_class)
                break;
        } else if (c == '[') {
            in_class = TRUE;
        } else if (c == ']') {
            /* XXX: incorrect as the first character in a class */
            in_class = FALSE;
        } else if (c == '\\') {
            if (string_buffer_putc8(b, c))
                goto fail;
            c = *p++;
            if (c == '\n' || c == '\r')
                goto eol_error;
            else if (c == '\0' && p >= s->buf_end)
                goto eof_error;
            else if (c >= 0x80) {
                const uint8_t *p_next;
                c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
                if (c > 0x10FFFF) {
                    goto invalid_utf8;
                }
                p = p_next;
                if (c == CP_LS || c == CP_PS)
                    goto eol_error;
            }
        } else if (c >= 0x80) {
            const uint8_t *p_next;
            c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
            invalid_utf8:
                js_parse_error(s, "invalid UTF-8 sequence");
                goto fail;
            }
            p = p_next;
            /* LS or PS are considered as line terminator */
            if (c == CP_LS || c == CP_PS) {
            eol_error:
                js_parse_error(s, "unexpected line terminator in regexp");
                goto fail;
            }
        }
        if (string_buffer_putc(b, c))
            goto fail;
    }

    /* flags */
    for(;;) {
        const uint8_t *p_next = p;
        c = *p_next++;
        if (c >= 0x80) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
                goto invalid_utf8;
            }
        }
        if (!lre_js_is_ident_next(c))
            break;
        if (string_buffer_putc(b2, c))
            goto fail;
        p = p_next;
    }

    s->token.val = TOK_REGEXP;
    s->token.u.regexp.body = string_buffer_end(b);
    s->token.u.regexp.flags = string_buffer_end(b2);
    s->buf_ptr = p;
    return 0;
 fail:
    string_buffer_free(b);
    string_buffer_free(b2);
    return -1;
}